

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dokick.c
# Opt level: O0

void impact_drop(obj *missile,xchar x,xchar y,xchar dlev)

{
  obj *poVar1;
  level *lev;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *local_a0;
  char *local_90;
  bool local_7a;
  bool local_79;
  long amt;
  char *what;
  coord cc;
  boolean isrock;
  boolean costly;
  long lStack_58;
  boolean angry;
  long robbed;
  long debit;
  long price;
  long dct;
  long oct;
  monst *shkp;
  obj *obj2;
  obj *obj;
  schar toloc;
  xchar dlev_local;
  xchar y_local;
  xchar x_local;
  obj *missile_local;
  
  if (level->objects[x][y] != (obj *)0x0) {
    obj._4_1_ = down_gate(x,y);
    drop_to((coord *)((long)&what + 3),obj._4_1_);
    if (what._4_1_ != '\0') {
      if (dlev != '\0') {
        obj._4_1_ = '\t';
        what._4_1_ = dlev;
      }
      what._6_1_ = costly_spot(x,y);
      lev = level;
      lStack_58 = 0;
      robbed = 0;
      debit = 0;
      what._7_1_ = 0;
      oct = 0;
      if (what._6_1_ != '\0') {
        pcVar4 = in_rooms(level,x,y,0x12);
        oct = (long)shop_keeper(lev,*pcVar4);
        if ((monst *)oct != (monst *)0x0) {
          robbed = (long)*(int *)&((monst *)(oct + 0xca8))->field_0x60;
          iVar3._0_1_ = ((monst *)(oct + 0xca8))->mtame;
          iVar3._1_1_ = ((monst *)(oct + 0xca8))->m_ap_type;
          iVar3._2_1_ = ((monst *)(oct + 0xca8))->mfrozen;
          iVar3._3_1_ = ((monst *)(oct + 0xca8))->mblinded;
          lStack_58 = (long)iVar3;
          what._7_1_ = ((*(uint *)&((monst *)oct)->field_0x60 >> 0x16 & 1) != 0 ^ 0xffU) & 1;
        }
      }
      local_79 = false;
      if (missile != (obj *)0x0) {
        local_79 = missile->otyp == 0x213;
      }
      what._5_1_ = local_79;
      price = 0;
      dct = 0;
      poVar1 = level->objects[x][y];
      while (obj2 = poVar1, obj2 != (obj *)0x0) {
        poVar1 = (obj2->v).v_nexthere;
        if (((((obj2 != missile) && (dct = obj2->quan + dct, obj2 != uball)) && (obj2 != uchain)) &&
            ((((*(uint *)&obj2->field_0x4a >> 0xd & 1) == 0 || (obj2->otyp == 0xda)) ||
             ((obj2->otyp == 0xdb || (obj2->otyp == 0xdc)))))) &&
           ((what._5_1_ == '\0' || (obj2->otyp != 0x214)))) {
          iVar3 = 3;
          if (obj2->otyp == 0x214) {
            iVar3 = 0x1e;
          }
          iVar3 = rn2(iVar3);
          if (iVar3 == 0) {
            obj_extract_self(obj2);
            if (what._6_1_ != '\0') {
              bVar2 = costly_spot(u.ux,u.uy);
              local_7a = false;
              if (bVar2 != '\0') {
                pcVar4 = in_rooms(level,x,y,0x12);
                pcVar4 = strchr(u.urooms,(int)*pcVar4);
                local_7a = pcVar4 != (char *)0x0;
              }
              lVar5 = stolen_value(obj2,x,y,local_7a,'\x01');
              debit = lVar5 + debit;
              if (obj2->cobj != (obj *)0x0) {
                picked_container(obj2);
              }
              if (obj2->oclass != '\f') {
                *(uint *)&obj2->field_0x4a = *(uint *)&obj2->field_0x4a & 0xfffffff7;
              }
            }
            deliver_object(obj2,what._3_1_,what._4_1_,(int)obj._4_1_);
            price = obj2->quan + price;
          }
        }
      }
      if ((price != 0) && ((viz_array[y][x] & 2U) != 0)) {
        local_a0 = "objects fall";
        if (price == 1) {
          local_a0 = "object falls";
        }
        if (missile == (obj *)0x0) {
          if (dct == price) {
            pcVar4 = "All the";
            if (price == 1) {
              pcVar4 = "The";
            }
            pline("%s adjacent %s %s.",pcVar4,local_a0,gate_str);
          }
          else {
            pcVar4 = "Some of the";
            if (price == 1) {
              pcVar4 = "One of the";
              local_a0 = "objects falls";
            }
            pline("%s adjacent %s %s.",pcVar4,local_a0,gate_str);
          }
        }
        else {
          if (price == dct) {
            local_90 = "the ";
          }
          else {
            local_90 = "";
            if (price == 1) {
              local_90 = "an";
            }
          }
          pline("From the impact, %sother %s.",local_90,local_a0);
        }
      }
      if (((what._6_1_ != '\0') && (oct != 0)) && (debit != 0)) {
        if (lStack_58 < *(int *)(oct + 0xd00)) {
          pcVar4 = currency(debit);
          pline("You removed %ld %s worth of goods!",debit,pcVar4);
          if ((viz_array[*(char *)(oct + 0x50)][*(char *)(oct + 0x4f)] & 2U) == 0) {
            You_hear("a scream, \"Thief!\"");
          }
          else {
            if (*(char *)(oct + 0xd1d) == '\0') {
              strncpy((char *)(oct + 0xd1d),plname,0x20);
            }
            if (what._7_1_ == 0) {
              pline("\"%s, you are a thief!\"",plname);
            }
            else {
              pcVar4 = Monnam((monst *)oct);
              pline("%s is infuriated!",pcVar4);
            }
          }
          hot_pursuit((monst *)oct);
          angry_guards('\0');
        }
        else if (robbed < *(int *)(oct + 0xd08)) {
          lVar5 = *(int *)(oct + 0xd08) - robbed;
          pcVar4 = Monnam((monst *)oct);
          pcVar6 = currency(lVar5);
          pline("You owe %s %ld %s for goods lost.",pcVar4,lVar5,pcVar6);
        }
      }
    }
  }
  return;
}

Assistant:

void impact_drop(struct obj *missile, xchar x, xchar y, xchar dlev)
{
	schar toloc;
	struct obj *obj, *obj2;
	struct monst *shkp;
	long oct, dct, price, debit, robbed;
	boolean angry, costly, isrock;
	coord cc;

	if (!OBJ_AT(x, y)) return;

	toloc = down_gate(x, y);
	drop_to(&cc, toloc);
	if (!cc.y) return;

	if (dlev) {
		/* send objects next to player falling through trap door.
		 * checked in obj_delivery().
		 */
		toloc = MIGR_NEAR_PLAYER;
		cc.y = dlev;
	}

	costly = costly_spot(x, y);
	price = debit = robbed = 0L;
	angry = FALSE;
	shkp = NULL;
	/* if 'costly', we must keep a record of ESHK(shkp) before
	 * it undergoes changes through the calls to stolen_value.
	 * the angry bit must be reset, if needed, in this fn, since
	 * stolen_value is called under the 'silent' flag to avoid
	 * unsavory pline repetitions.
	 */
	if (costly) {
	    if ((shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE))) != 0) {
		debit	= ESHK(shkp)->debit;
		robbed	= ESHK(shkp)->robbed;
		angry	= !shkp->mpeaceful;
	    }
	}

	isrock = (missile && missile->otyp == ROCK);
	oct = dct = 0L;
	for (obj = level->objects[x][y]; obj; obj = obj2) {
		obj2 = obj->nexthere;
		if (obj == missile) continue;
		/* number of objects in the pile */
		oct += obj->quan;
		if (obj == uball || obj == uchain) continue;
		/* level prizes never fall */
		if (Is_prize(obj)) continue;
		/* boulders can fall too, but rarely & never due to rocks */
		if ((isrock && obj->otyp == BOULDER) ||
		   rn2(obj->otyp == BOULDER ? 30 : 3)) continue;
		obj_extract_self(obj);

		if (costly) {
		    price += stolen_value(obj, x, y,
				(costly_spot(u.ux, u.uy) &&
				 strchr(u.urooms, *in_rooms(level, x, y, SHOPBASE))),
				TRUE);
		    /* set obj->no_charge to 0 */
		    if (Has_contents(obj))
			picked_container(obj);	/* does the right thing */
		    if (obj->oclass != COIN_CLASS)
			obj->no_charge = 0;
		}

		deliver_object(obj, cc.x, cc.y, toloc);

		/* number of fallen objects */
		dct += obj->quan;
	}

	if (dct && cansee(x,y)) {	/* at least one object fell */
	    const char *what = (dct == 1L ? "object falls" : "objects fall");

	    if (missile)
		pline("From the impact, %sother %s.",
		      dct == oct ? "the " : dct == 1L ? "an" : "", what);
	    else if (oct == dct)
		pline("%s adjacent %s %s.",
		      dct == 1L ? "The" : "All the", what, gate_str);
	    else
		pline("%s adjacent %s %s.",
		      dct == 1L ? "One of the" : "Some of the",
		      dct == 1L ? "objects falls" : what, gate_str);
	}

	if (costly && shkp && price) {
		if (ESHK(shkp)->robbed > robbed) {
		    pline("You removed %ld %s worth of goods!", price, currency(price));
		    if (cansee(shkp->mx, shkp->my)) {
			if (ESHK(shkp)->customer[0] == 0)
			    strncpy(ESHK(shkp)->customer,
					   plname, PL_NSIZ);
			if (angry)
			    pline("%s is infuriated!", Monnam(shkp));
			else pline("\"%s, you are a thief!\"", plname);
		    } else  You_hear("a scream, \"Thief!\"");
		    hot_pursuit(shkp);
		    angry_guards(FALSE);
		    return;
		}
		if (ESHK(shkp)->debit > debit) {
		    long amt = (ESHK(shkp)->debit - debit);
		    pline("You owe %s %ld %s for goods lost.",
			Monnam(shkp),
			amt, currency(amt));
		}
	}

}